

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O0

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::onRecoverableException
          (MockExceptionCallback *this,Exception *exception)

{
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar1;
  char *pcVar2;
  char *pcVar3;
  Exception *params;
  unsigned_long *end;
  StringPtr local_60;
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  NullableValue<unsigned_long> _end134;
  String what;
  Exception *exception_local;
  MockExceptionCallback *this_local;
  
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&this->text,"recoverable exception: ");
  str<kj::Exception&>((String *)&_end134.field_1,(kj *)exception,params);
  StringPtr::StringPtr(&local_60,"\nstack: ");
  String::find((String *)local_50,(StringPtr *)&_end134.field_1);
  other = readMaybe<unsigned_long>((Maybe<unsigned_long> *)local_50);
  NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_40,other);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_50);
  puVar1 = _::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_40);
  if (puVar1 == (unsigned_long *)0x0) {
    pcVar2 = String::cStr((String *)&_end134.field_1);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (&this->text,pcVar2);
  }
  else {
    puVar1 = NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_40);
    pcVar2 = String::cStr((String *)&_end134.field_1);
    pcVar3 = String::cStr((String *)&_end134.field_1);
    ::std::__cxx11::string::append<char_const*,void>((string *)&this->text,pcVar2,pcVar3 + *puVar1);
  }
  NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_40);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&this->text,'\n');
  flush(this);
  String::~String((String *)&_end134.field_1);
  return;
}

Assistant:

void onRecoverableException(Exception&& exception) override {
    text += "recoverable exception: ";
    auto what = str(exception);
    // Discard the stack trace.
    KJ_IF_SOME(end, what.find("\nstack: ")) {
      text.append(what.cStr(), what.cStr()+end);
    } else {
      text += what.cStr();
    }